

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_current_line(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,render_handler *handler,
                   context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *ctx,component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *comp)

{
  char cVar1;
  size_type sVar2;
  size_type sVar3;
  
  if ((ctx->line_buffer).contained_section_tag == true) {
    sVar2 = (ctx->line_buffer).data._M_string_length;
    if (sVar2 != 0) {
      sVar3 = 0;
      do {
        cVar1 = (ctx->line_buffer).data._M_dataplus._M_p[sVar3];
        if ((cVar1 != ' ') && (cVar1 != '\t')) goto LAB_001de20f;
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
  }
  else {
LAB_001de20f:
    if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001de250:
      std::__throw_bad_function_call();
    }
    (*handler->_M_invoker)((_Any_data *)handler,&(ctx->line_buffer).data);
    if (comp != (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
      if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001de250;
      (*handler->_M_invoker)((_Any_data *)handler,&comp->text);
    }
  }
  (ctx->line_buffer).data._M_string_length = 0;
  *(ctx->line_buffer).data._M_dataplus._M_p = '\0';
  (ctx->line_buffer).contained_section_tag = false;
  return;
}

Assistant:

void render_current_line(const render_handler& handler, context_internal<string_type>& ctx, const component<string_type>* comp) const {
        // We're at the end of a line, so check the line buffer state to see
        // if the line had tags in it, and also if the line is now empty or
        // contains whitespace only. if this situation is true, skip the line.
        bool output = true;
        if (ctx.line_buffer.contained_section_tag && ctx.line_buffer.is_empty_or_contains_only_whitespace()) {
            output = false;
        }
        if (output) {
            handler(ctx.line_buffer.data);
            if (comp) {
                handler(comp->text);
            }
        }
        ctx.line_buffer.clear();
    }